

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser-test.c++
# Opt level: O2

void __thiscall capnp::anon_unknown_0::TestCase63::run(TestCase63 *this)

{
  ArrayPtr<const_kj::StringPtr> importPath_00;
  ArrayPtr<const_kj::StringPtr> importPath_01;
  ArrayPtr<const_kj::StringPtr> importPath_02;
  ArrayPtr<const_kj::StringPtr> importPath_03;
  ArrayPtr<const_kj::StringPtr> importPath_04;
  Field field;
  Field field_00;
  Field field_01;
  Field field_02;
  Field field_03;
  Field field_04;
  Field field_05;
  Field field_06;
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  StructSchema SVar4;
  uint64_t uVar5;
  Schema SVar6;
  Arena *pAVar7;
  ParsedSchema PVar8;
  Reader RVar9;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr displayName;
  StringPtr nestedName;
  StringPtr displayName_00;
  StringPtr nestedName_00;
  StringPtr displayName_01;
  StringPtr nestedName_01;
  StringPtr displayName_02;
  StringPtr nestedName_02;
  StringPtr displayName_03;
  StringPtr content;
  StringPtr content_00;
  StringPtr content_01;
  StringPtr content_02;
  StringPtr content_03;
  StringPtr content_04;
  StringPtr diskPath;
  StringPtr diskPath_00;
  StringPtr diskPath_01;
  StringPtr diskPath_02;
  StringPtr diskPath_03;
  Fault f;
  CapTableReader *local_468;
  SegmentReader *local_460;
  uint local_450;
  ParsedSchema corgeSchema;
  ParsedSchema graultSchema;
  ParsedSchema wrongGraultSchema;
  StructSchema graultStruct;
  StructSchema corgeStruct;
  StructSchema bazStruct;
  ParsedSchema barStruct;
  ParsedSchema bazSchema;
  ArrayPtr<const_char> local_3a0;
  SchemaParser parser;
  FieldList barFields;
  FakeFileReader reader;
  Arena *local_2b0;
  ParsedSchema barSchema;
  Reader barProto;
  Field local_268;
  Field local_228;
  Field local_1e8;
  Field local_1a8;
  Field local_168;
  Field local_128;
  Field local_e8;
  Field local_a8;
  StringPtr importPath [3];
  
  FakeFileReader::FakeFileReader(&reader);
  SchemaParser::SchemaParser(&parser);
  SchemaParser::setDiskFilesystem(&parser,&reader.super_Filesystem);
  name.content.size_ = 0x12;
  name.content.ptr = "src/foo/bar.capnp";
  content.content.size_ = 0xce;
  content.content.ptr =
       "@0x8123456789abcdef;\nstruct Bar {\n  baz @0: import \"baz.capnp\".Baz;\n  corge @1: import \"../qux/corge.capnp\".Corge;\n  grault @2: import \"/grault.capnp\".Grault;\n  garply @3: import \"/garply.capnp\".Garply;\n}\n"
  ;
  FakeFileReader::add(&reader,name,content);
  name_00.content.size_ = 0x12;
  name_00.content.ptr = "src/foo/baz.capnp";
  content_00.content.size_ = 0x24;
  content_00.content.ptr = "@0x823456789abcdef1;\nstruct Baz {}\n";
  FakeFileReader::add(&reader,name_00,content_00);
  name_01.content.size_ = 0x14;
  name_01.content.ptr = "src/qux/corge.capnp";
  content_01.content.size_ = 0x26;
  content_01.content.ptr = "@0x83456789abcdef12;\nstruct Corge {}\n";
  FakeFileReader::add(&reader,name_01,content_01);
  name_02.content.size_ = 0x1a;
  name_02.content.ptr = "/usr/include/grault.capnp";
  content_02.content.size_ = 0x27;
  content_02.content.ptr = "@0x8456789abcdef123;\nstruct Grault {}\n";
  FakeFileReader::add(&reader,name_02,content_02);
  name_03.content.size_ = 0x1a;
  name_03.content.ptr = "/opt/include/grault.capnp";
  content_03.content.size_ = 0x2c;
  content_03.content.ptr = "@0x8000000000000001;\nstruct WrongGrault {}\n";
  FakeFileReader::add(&reader,name_03,content_03);
  name_04.content.size_ = 0x20;
  name_04.content.ptr = "/usr/local/include/garply.capnp";
  content_04.content.size_ = 0x27;
  content_04.content.ptr = "@0x856789abcdef1234;\nstruct Garply {}\n";
  FakeFileReader::add(&reader,name_04,content_04);
  importPath[0].content.ptr = "/usr/include";
  importPath[0].content.size_ = 0xd;
  importPath[1].content.ptr = "/usr/local/include";
  importPath[1].content.size_ = 0x13;
  importPath[2].content.ptr = "/opt/include";
  importPath[2].content.size_ = 0xd;
  importPath_00.size_ = 3;
  importPath_00.ptr = importPath;
  displayName.content.size_ = 0x10;
  displayName.content.ptr = "foo2/bar2.capnp";
  diskPath.content.size_ = 0x12;
  diskPath.content.ptr = "src/foo/bar.capnp";
  barSchema = SchemaParser::parseDiskFile(&parser,displayName,diskPath,importPath_00);
  Schema::getProto(&barProto,&barSchema.super_Schema);
  if (barProto._reader.dataSize < 0x40) {
    if (2 < kj::_::Debug::minSeverity) goto LAB_0033c17f;
    SVar6.raw = (RawBrandedSchema *)0x0;
  }
  else {
    SVar6.raw = *barProto._reader.data;
    if ((SVar6.raw == (RawBrandedSchema *)0x8123456789abcdef) || (2 < kj::_::Debug::minSeverity))
    goto LAB_0033c17f;
  }
  f.exception = (Exception *)0x8123456789abcdef;
  barFields.parent.super_Schema.raw = (Schema)(Schema)SVar6.raw;
  kj::_::Debug::log<char_const(&)[63],unsigned_long_long,unsigned_long>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
             ,100,ERROR,
             "\"failed: expected \" \"(0x8123456789abcdefull) == (barProto.getId())\", 0x8123456789abcdefull, barProto.getId()"
             ,(char (*) [63])"failed: expected (0x8123456789abcdefull) == (barProto.getId())",
             (unsigned_long_long *)&f,(unsigned_long *)&barFields);
LAB_0033c17f:
  _f = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&barProto);
  bVar3 = kj::operator==("foo2/bar2.capnp",(StringPtr *)&f);
  if (!bVar3 && kj::_::Debug::minSeverity < 3) {
    _f = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&barProto);
    kj::_::Debug::log<char_const(&)[68],char_const(&)[16],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x65,ERROR,
               "\"failed: expected \" \"(\\\"foo2/bar2.capnp\\\") == (barProto.getDisplayName())\", \"foo2/bar2.capnp\", barProto.getDisplayName()"
               ,(char (*) [68])
                "failed: expected (\"foo2/bar2.capnp\") == (barProto.getDisplayName())",
               (char (*) [16])"foo2/bar2.capnp",(Reader *)&f);
  }
  nestedName.content.size_ = 4;
  nestedName.content.ptr = "Bar";
  barStruct = ParsedSchema::getNested(&barSchema,nestedName);
  SVar4 = Schema::asStruct(&barStruct.super_Schema);
  f.exception = (Exception *)SVar4.super_Schema.raw;
  StructSchema::getFields(&barFields,(StructSchema *)&f);
  if (barFields.list.reader.elementCount != 4) {
    bazSchema.super_Schema.raw._0_4_ = 4;
    corgeSchema.super_Schema.raw._0_4_ = barFields.list.reader.elementCount;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x69,FAILED,"(4u) == (barFields.size())","4u, barFields.size()",(uint *)&bazSchema,
               (uint *)&corgeSchema);
    kj::_::Debug::Fault::fatal(&f);
  }
  StructSchema::FieldList::operator[]((Field *)&f,&barFields,0);
  bazSchema.super_Schema.raw._0_4_ = SUB84(local_460,0);
  uVar1 = bazSchema.super_Schema.raw._0_4_;
  bazSchema.super_Schema.raw._4_4_ = (undefined4)((ulong)local_460 >> 0x20);
  uVar2 = bazSchema.super_Schema.raw._4_4_;
  corgeSchema = (ParsedSchema)capnp::schema::Field::Reader::getName((Reader *)&bazSchema);
  bVar3 = kj::operator==("baz",(StringPtr *)&corgeSchema);
  if (!bVar3 && kj::_::Debug::minSeverity < 3) {
    StructSchema::FieldList::operator[]((Field *)&f,&barFields,0);
    bazSchema.super_Schema.raw._0_4_ = uVar1;
    bazSchema.super_Schema.raw._4_4_ = uVar2;
    corgeSchema = (ParsedSchema)capnp::schema::Field::Reader::getName((Reader *)&bazSchema);
    kj::_::Debug::log<char_const(&)[64],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x6a,ERROR,
               "\"failed: expected \" \"(\\\"baz\\\") == (barFields[0].getProto().getName())\", \"baz\", barFields[0].getProto().getName()"
               ,(char (*) [64])"failed: expected (\"baz\") == (barFields[0].getProto().getName())",
               (char (*) [4])0x518f2f,(Reader *)&corgeSchema);
  }
  StructSchema::FieldList::operator[](&local_a8,&barFields,0);
  field._8_8_ = wrongGraultSchema.parser;
  field.parent.super_Schema.raw = (Schema)(Schema)wrongGraultSchema.super_Schema.raw;
  field.proto._reader.segment = (SegmentReader *)graultStruct.super_Schema.raw;
  field.proto._reader.capTable = (CapTableReader *)corgeStruct.super_Schema.raw;
  field.proto._reader.data = (void *)bazStruct.super_Schema.raw;
  field.proto._reader._24_16_ = barStruct;
  field.proto._reader.nestingLimit = bazSchema.super_Schema.raw._0_4_;
  field.proto._reader._44_4_ = bazSchema.super_Schema.raw._4_4_;
  uVar5 = getFieldTypeFileId(field);
  if ((uVar5 != 0x823456789abcdef1) && (kj::_::Debug::minSeverity < 3)) {
    f.exception = (Exception *)0x823456789abcdef1;
    StructSchema::FieldList::operator[](&local_e8,&barFields,0);
    field_00._8_8_ = wrongGraultSchema.parser;
    field_00.parent.super_Schema.raw = (Schema)(Schema)wrongGraultSchema.super_Schema.raw;
    field_00.proto._reader.segment = (SegmentReader *)graultStruct.super_Schema.raw;
    field_00.proto._reader.capTable = (CapTableReader *)corgeStruct.super_Schema.raw;
    field_00.proto._reader.data = (void *)bazStruct.super_Schema.raw;
    field_00.proto._reader._24_16_ = barStruct;
    field_00.proto._reader.nestingLimit = bazSchema.super_Schema.raw._0_4_;
    field_00.proto._reader._44_4_ = bazSchema.super_Schema.raw._4_4_;
    uVar5 = getFieldTypeFileId(field_00);
    bazSchema.super_Schema.raw._0_4_ = (undefined4)uVar5;
    bazSchema.super_Schema.raw._4_4_ = (undefined4)(uVar5 >> 0x20);
    kj::_::Debug::log<char_const(&)[79],unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x6b,ERROR,
               "\"failed: expected \" \"(0x823456789abcdef1ull) == (getFieldTypeFileId(barFields[0]))\", 0x823456789abcdef1ull, getFieldTypeFileId(barFields[0])"
               ,(char (*) [79])
                "failed: expected (0x823456789abcdef1ull) == (getFieldTypeFileId(barFields[0]))",
               (unsigned_long_long *)&f,(unsigned_long *)&bazSchema);
  }
  StructSchema::FieldList::operator[]((Field *)&f,&barFields,1);
  bazSchema.super_Schema.raw._0_4_ = uVar1;
  bazSchema.super_Schema.raw._4_4_ = uVar2;
  corgeSchema = (ParsedSchema)capnp::schema::Field::Reader::getName((Reader *)&bazSchema);
  bVar3 = kj::operator==("corge",(StringPtr *)&corgeSchema);
  if (!bVar3 && kj::_::Debug::minSeverity < 3) {
    StructSchema::FieldList::operator[]((Field *)&f,&barFields,1);
    bazSchema.super_Schema.raw._0_4_ = uVar1;
    bazSchema.super_Schema.raw._4_4_ = uVar2;
    corgeSchema = (ParsedSchema)capnp::schema::Field::Reader::getName((Reader *)&bazSchema);
    kj::_::Debug::log<char_const(&)[66],char_const(&)[6],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x6c,ERROR,
               "\"failed: expected \" \"(\\\"corge\\\") == (barFields[1].getProto().getName())\", \"corge\", barFields[1].getProto().getName()"
               ,(char (*) [66])"failed: expected (\"corge\") == (barFields[1].getProto().getName())"
               ,(char (*) [6])"corge",(Reader *)&corgeSchema);
  }
  StructSchema::FieldList::operator[](&local_128,&barFields,1);
  field_01._8_8_ = wrongGraultSchema.parser;
  field_01.parent.super_Schema.raw = (Schema)(Schema)wrongGraultSchema.super_Schema.raw;
  field_01.proto._reader.segment = (SegmentReader *)graultStruct.super_Schema.raw;
  field_01.proto._reader.capTable = (CapTableReader *)corgeStruct.super_Schema.raw;
  field_01.proto._reader.data = (void *)bazStruct.super_Schema.raw;
  field_01.proto._reader._24_16_ = barStruct;
  field_01.proto._reader.nestingLimit = bazSchema.super_Schema.raw._0_4_;
  field_01.proto._reader._44_4_ = bazSchema.super_Schema.raw._4_4_;
  uVar5 = getFieldTypeFileId(field_01);
  if ((uVar5 != 0x83456789abcdef12) && (kj::_::Debug::minSeverity < 3)) {
    f.exception = (Exception *)0x83456789abcdef12;
    StructSchema::FieldList::operator[](&local_168,&barFields,1);
    field_02._8_8_ = wrongGraultSchema.parser;
    field_02.parent.super_Schema.raw = (Schema)(Schema)wrongGraultSchema.super_Schema.raw;
    field_02.proto._reader.segment = (SegmentReader *)graultStruct.super_Schema.raw;
    field_02.proto._reader.capTable = (CapTableReader *)corgeStruct.super_Schema.raw;
    field_02.proto._reader.data = (void *)bazStruct.super_Schema.raw;
    field_02.proto._reader._24_16_ = barStruct;
    field_02.proto._reader.nestingLimit = bazSchema.super_Schema.raw._0_4_;
    field_02.proto._reader._44_4_ = bazSchema.super_Schema.raw._4_4_;
    uVar5 = getFieldTypeFileId(field_02);
    bazSchema.super_Schema.raw._0_4_ = (undefined4)uVar5;
    bazSchema.super_Schema.raw._4_4_ = (undefined4)(uVar5 >> 0x20);
    kj::_::Debug::log<char_const(&)[79],unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x6d,ERROR,
               "\"failed: expected \" \"(0x83456789abcdef12ull) == (getFieldTypeFileId(barFields[1]))\", 0x83456789abcdef12ull, getFieldTypeFileId(barFields[1])"
               ,(char (*) [79])
                "failed: expected (0x83456789abcdef12ull) == (getFieldTypeFileId(barFields[1]))",
               (unsigned_long_long *)&f,(unsigned_long *)&bazSchema);
  }
  StructSchema::FieldList::operator[]((Field *)&f,&barFields,2);
  bazSchema.super_Schema.raw._0_4_ = uVar1;
  bazSchema.super_Schema.raw._4_4_ = uVar2;
  corgeSchema = (ParsedSchema)capnp::schema::Field::Reader::getName((Reader *)&bazSchema);
  bVar3 = kj::operator==("grault",(StringPtr *)&corgeSchema);
  if (!bVar3 && kj::_::Debug::minSeverity < 3) {
    StructSchema::FieldList::operator[]((Field *)&f,&barFields,2);
    bazSchema.super_Schema.raw._0_4_ = uVar1;
    bazSchema.super_Schema.raw._4_4_ = uVar2;
    corgeSchema = (ParsedSchema)capnp::schema::Field::Reader::getName((Reader *)&bazSchema);
    kj::_::Debug::log<char_const(&)[67],char_const(&)[7],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x6e,ERROR,
               "\"failed: expected \" \"(\\\"grault\\\") == (barFields[2].getProto().getName())\", \"grault\", barFields[2].getProto().getName()"
               ,(char (*) [67])
                "failed: expected (\"grault\") == (barFields[2].getProto().getName())",
               (char (*) [7])"grault",(Reader *)&corgeSchema);
  }
  StructSchema::FieldList::operator[](&local_1a8,&barFields,2);
  field_03._8_8_ = wrongGraultSchema.parser;
  field_03.parent.super_Schema.raw = (Schema)(Schema)wrongGraultSchema.super_Schema.raw;
  field_03.proto._reader.segment = (SegmentReader *)graultStruct.super_Schema.raw;
  field_03.proto._reader.capTable = (CapTableReader *)corgeStruct.super_Schema.raw;
  field_03.proto._reader.data = (void *)bazStruct.super_Schema.raw;
  field_03.proto._reader._24_16_ = barStruct;
  field_03.proto._reader.nestingLimit = bazSchema.super_Schema.raw._0_4_;
  field_03.proto._reader._44_4_ = bazSchema.super_Schema.raw._4_4_;
  uVar5 = getFieldTypeFileId(field_03);
  if ((uVar5 != 0x8456789abcdef123) && (kj::_::Debug::minSeverity < 3)) {
    f.exception = (Exception *)0x8456789abcdef123;
    StructSchema::FieldList::operator[](&local_1e8,&barFields,2);
    field_04._8_8_ = wrongGraultSchema.parser;
    field_04.parent.super_Schema.raw = (Schema)(Schema)wrongGraultSchema.super_Schema.raw;
    field_04.proto._reader.segment = (SegmentReader *)graultStruct.super_Schema.raw;
    field_04.proto._reader.capTable = (CapTableReader *)corgeStruct.super_Schema.raw;
    field_04.proto._reader.data = (void *)bazStruct.super_Schema.raw;
    field_04.proto._reader._24_16_ = barStruct;
    field_04.proto._reader.nestingLimit = bazSchema.super_Schema.raw._0_4_;
    field_04.proto._reader._44_4_ = bazSchema.super_Schema.raw._4_4_;
    uVar5 = getFieldTypeFileId(field_04);
    bazSchema.super_Schema.raw._0_4_ = (undefined4)uVar5;
    bazSchema.super_Schema.raw._4_4_ = (undefined4)(uVar5 >> 0x20);
    kj::_::Debug::log<char_const(&)[79],unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x6f,ERROR,
               "\"failed: expected \" \"(0x8456789abcdef123ull) == (getFieldTypeFileId(barFields[2]))\", 0x8456789abcdef123ull, getFieldTypeFileId(barFields[2])"
               ,(char (*) [79])
                "failed: expected (0x8456789abcdef123ull) == (getFieldTypeFileId(barFields[2]))",
               (unsigned_long_long *)&f,(unsigned_long *)&bazSchema);
  }
  StructSchema::FieldList::operator[]((Field *)&f,&barFields,3);
  bazSchema.super_Schema.raw._0_4_ = uVar1;
  bazSchema.super_Schema.raw._4_4_ = uVar2;
  corgeSchema = (ParsedSchema)capnp::schema::Field::Reader::getName((Reader *)&bazSchema);
  bVar3 = kj::operator==("garply",(StringPtr *)&corgeSchema);
  if (!bVar3 && kj::_::Debug::minSeverity < 3) {
    StructSchema::FieldList::operator[]((Field *)&f,&barFields,3);
    bazSchema.super_Schema.raw._0_4_ = uVar1;
    bazSchema.super_Schema.raw._4_4_ = uVar2;
    corgeSchema = (ParsedSchema)capnp::schema::Field::Reader::getName((Reader *)&bazSchema);
    kj::_::Debug::log<char_const(&)[67],char_const(&)[7],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x70,ERROR,
               "\"failed: expected \" \"(\\\"garply\\\") == (barFields[3].getProto().getName())\", \"garply\", barFields[3].getProto().getName()"
               ,(char (*) [67])
                "failed: expected (\"garply\") == (barFields[3].getProto().getName())",
               (char (*) [7])0x503cbd,(Reader *)&corgeSchema);
  }
  StructSchema::FieldList::operator[](&local_228,&barFields,3);
  field_05._8_8_ = wrongGraultSchema.parser;
  field_05.parent.super_Schema.raw = (Schema)(Schema)wrongGraultSchema.super_Schema.raw;
  field_05.proto._reader.segment = (SegmentReader *)graultStruct.super_Schema.raw;
  field_05.proto._reader.capTable = (CapTableReader *)corgeStruct.super_Schema.raw;
  field_05.proto._reader.data = (void *)bazStruct.super_Schema.raw;
  field_05.proto._reader._24_16_ = barStruct;
  field_05.proto._reader.nestingLimit = bazSchema.super_Schema.raw._0_4_;
  field_05.proto._reader._44_4_ = bazSchema.super_Schema.raw._4_4_;
  uVar5 = getFieldTypeFileId(field_05);
  if ((uVar5 != 0x856789abcdef1234) && (kj::_::Debug::minSeverity < 3)) {
    f.exception = (Exception *)0x856789abcdef1234;
    StructSchema::FieldList::operator[](&local_268,&barFields,3);
    field_06._8_8_ = wrongGraultSchema.parser;
    field_06.parent.super_Schema.raw = (Schema)(Schema)wrongGraultSchema.super_Schema.raw;
    field_06.proto._reader.segment = (SegmentReader *)graultStruct.super_Schema.raw;
    field_06.proto._reader.capTable = (CapTableReader *)corgeStruct.super_Schema.raw;
    field_06.proto._reader.data = (void *)bazStruct.super_Schema.raw;
    field_06.proto._reader._24_16_ = barStruct;
    field_06.proto._reader.nestingLimit = bazSchema.super_Schema.raw._0_4_;
    field_06.proto._reader._44_4_ = bazSchema.super_Schema.raw._4_4_;
    uVar5 = getFieldTypeFileId(field_06);
    bazSchema.super_Schema.raw._0_4_ = (undefined4)uVar5;
    bazSchema.super_Schema.raw._4_4_ = (undefined4)(uVar5 >> 0x20);
    kj::_::Debug::log<char_const(&)[79],unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x71,ERROR,
               "\"failed: expected \" \"(0x856789abcdef1234ull) == (getFieldTypeFileId(barFields[3]))\", 0x856789abcdef1234ull, getFieldTypeFileId(barFields[3])"
               ,(char (*) [79])
                "failed: expected (0x856789abcdef1234ull) == (getFieldTypeFileId(barFields[3]))",
               (unsigned_long_long *)&f,(unsigned_long *)&bazSchema);
  }
  importPath_01.size_ = 3;
  importPath_01.ptr = importPath;
  displayName_00.content.size_ = 0x20;
  displayName_00.content.ptr = "not/used/because/already/loaded";
  diskPath_00.content.size_ = 0x12;
  diskPath_00.content.ptr = "src/foo/baz.capnp";
  PVar8 = SchemaParser::parseDiskFile(&parser,displayName_00,diskPath_00,importPath_01);
  bazSchema.super_Schema.raw._0_4_ = PVar8.super_Schema.raw._0_4_;
  bazSchema.super_Schema.raw._4_4_ = PVar8.super_Schema.raw._4_4_;
  bazSchema.parser = PVar8.parser;
  Schema::getProto((Reader *)&f,&bazSchema.super_Schema);
  if (((local_450 < 0x40) || (local_460->arena != (Arena *)0x823456789abcdef1)) &&
     (kj::_::Debug::minSeverity < 3)) {
    corgeSchema.super_Schema.raw = (RawBrandedSchema *)0x823456789abcdef1;
    Schema::getProto((Reader *)&f,&bazSchema.super_Schema);
    if (local_450 < 0x40) {
      graultSchema.super_Schema.raw = (RawBrandedSchema *)0x0;
    }
    else {
      graultSchema.super_Schema.raw = (RawBrandedSchema *)local_460->arena;
    }
    kj::_::Debug::log<char_const(&)[75],unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x76,ERROR,
               "\"failed: expected \" \"(0x823456789abcdef1ull) == (bazSchema.getProto().getId())\", 0x823456789abcdef1ull, bazSchema.getProto().getId()"
               ,(char (*) [75])
                "failed: expected (0x823456789abcdef1ull) == (bazSchema.getProto().getId())",
               (unsigned_long_long *)&corgeSchema,(unsigned_long *)&graultSchema);
  }
  Schema::getProto((Reader *)&f,&bazSchema.super_Schema);
  corgeSchema = (ParsedSchema)capnp::schema::Node::Reader::getDisplayName((Reader *)&f);
  bVar3 = kj::operator==("foo2/baz.capnp",(StringPtr *)&corgeSchema);
  if (!bVar3 && kj::_::Debug::minSeverity < 3) {
    Schema::getProto((Reader *)&f,&bazSchema.super_Schema);
    corgeSchema = (ParsedSchema)capnp::schema::Node::Reader::getDisplayName((Reader *)&f);
    kj::_::Debug::log<char_const(&)[79],char_const(&)[15],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x77,ERROR,
               "\"failed: expected \" \"(\\\"foo2/baz.capnp\\\") == (bazSchema.getProto().getDisplayName())\", \"foo2/baz.capnp\", bazSchema.getProto().getDisplayName()"
               ,(char (*) [79])
                "failed: expected (\"foo2/baz.capnp\") == (bazSchema.getProto().getDisplayName())",
               (char (*) [15])"foo2/baz.capnp",(Reader *)&corgeSchema);
  }
  nestedName_00.content.size_ = 4;
  nestedName_00.content.ptr = "Baz";
  _f = (ArrayPtr<const_char>)ParsedSchema::getNested(&bazSchema,nestedName_00);
  bazStruct = Schema::asStruct((Schema *)&f);
  Schema::getProto((Reader *)&f,&bazStruct.super_Schema);
  if (local_450 < 0x40) {
    pAVar7 = (Arena *)0x0;
  }
  else {
    pAVar7 = local_460->arena;
  }
  SVar6 = Schema::getDependency(&barStruct.super_Schema,(uint64_t)pAVar7);
  if ((bazStruct.super_Schema.raw != (Schema)SVar6.raw) && (kj::_::Debug::minSeverity < 3)) {
    Schema::getProto((Reader *)&f,&bazStruct.super_Schema);
    if (local_450 < 0x40) {
      pAVar7 = (Arena *)0x0;
    }
    else {
      pAVar7 = local_460->arena;
    }
    SVar6 = Schema::getDependency(&barStruct.super_Schema,(uint64_t)pAVar7);
    corgeSchema.super_Schema.raw = SVar6.raw;
    kj::_::Debug::log<char_const(&)[88],capnp::StructSchema&,capnp::Schema>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x79,ERROR,
               "\"failed: expected \" \"(bazStruct) == (barStruct.getDependency(bazStruct.getProto().getId()))\", bazStruct, barStruct.getDependency(bazStruct.getProto().getId())"
               ,(char (*) [88])
                "failed: expected (bazStruct) == (barStruct.getDependency(bazStruct.getProto().getId()))"
               ,&bazStruct,&corgeSchema.super_Schema);
  }
  importPath_02.size_ = 3;
  importPath_02.ptr = importPath;
  displayName_01.content.size_ = 0x20;
  displayName_01.content.ptr = "not/used/because/already/loaded";
  diskPath_01.content.size_ = 0x14;
  diskPath_01.content.ptr = "src/qux/corge.capnp";
  corgeSchema = SchemaParser::parseDiskFile(&parser,displayName_01,diskPath_01,importPath_02);
  Schema::getProto((Reader *)&f,&corgeSchema.super_Schema);
  if (((local_450 < 0x40) || (local_460->arena != (Arena *)0x83456789abcdef12)) &&
     (kj::_::Debug::minSeverity < 3)) {
    graultSchema.super_Schema.raw = (RawBrandedSchema *)0x83456789abcdef12;
    Schema::getProto((Reader *)&f,&corgeSchema.super_Schema);
    if (local_450 < 0x40) {
      wrongGraultSchema.super_Schema.raw = (RawBrandedSchema *)0x0;
    }
    else {
      wrongGraultSchema.super_Schema.raw = (RawBrandedSchema *)local_460->arena;
    }
    kj::_::Debug::log<char_const(&)[77],unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x7e,ERROR,
               "\"failed: expected \" \"(0x83456789abcdef12ull) == (corgeSchema.getProto().getId())\", 0x83456789abcdef12ull, corgeSchema.getProto().getId()"
               ,(char (*) [77])
                "failed: expected (0x83456789abcdef12ull) == (corgeSchema.getProto().getId())",
               (unsigned_long_long *)&graultSchema,(unsigned_long *)&wrongGraultSchema);
  }
  Schema::getProto((Reader *)&f,&corgeSchema.super_Schema);
  graultSchema = (ParsedSchema)capnp::schema::Node::Reader::getDisplayName((Reader *)&f);
  bVar3 = kj::operator==("qux/corge.capnp",(StringPtr *)&graultSchema);
  if (!bVar3 && kj::_::Debug::minSeverity < 3) {
    Schema::getProto((Reader *)&f,&corgeSchema.super_Schema);
    graultSchema = (ParsedSchema)capnp::schema::Node::Reader::getDisplayName((Reader *)&f);
    kj::_::Debug::log<char_const(&)[82],char_const(&)[16],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x7f,ERROR,
               "\"failed: expected \" \"(\\\"qux/corge.capnp\\\") == (corgeSchema.getProto().getDisplayName())\", \"qux/corge.capnp\", corgeSchema.getProto().getDisplayName()"
               ,(char (*) [82])
                "failed: expected (\"qux/corge.capnp\") == (corgeSchema.getProto().getDisplayName())"
               ,(char (*) [16])0x4dcb36,(Reader *)&graultSchema);
  }
  nestedName_01.content.size_ = 6;
  nestedName_01.content.ptr = "Corge";
  _f = (ArrayPtr<const_char>)ParsedSchema::getNested(&corgeSchema,nestedName_01);
  corgeStruct = Schema::asStruct((Schema *)&f);
  Schema::getProto((Reader *)&f,&corgeStruct.super_Schema);
  if (local_450 < 0x40) {
    pAVar7 = (Arena *)0x0;
  }
  else {
    pAVar7 = local_460->arena;
  }
  SVar6 = Schema::getDependency(&barStruct.super_Schema,(uint64_t)pAVar7);
  if ((corgeStruct.super_Schema.raw != (Schema)SVar6.raw) && (kj::_::Debug::minSeverity < 3)) {
    Schema::getProto((Reader *)&f,&corgeStruct.super_Schema);
    if (local_450 < 0x40) {
      pAVar7 = (Arena *)0x0;
    }
    else {
      pAVar7 = local_460->arena;
    }
    SVar6 = Schema::getDependency(&barStruct.super_Schema,(uint64_t)pAVar7);
    graultSchema.super_Schema.raw = SVar6.raw;
    kj::_::Debug::log<char_const(&)[92],capnp::StructSchema&,capnp::Schema>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x81,ERROR,
               "\"failed: expected \" \"(corgeStruct) == (barStruct.getDependency(corgeStruct.getProto().getId()))\", corgeStruct, barStruct.getDependency(corgeStruct.getProto().getId())"
               ,(char (*) [92])
                "failed: expected (corgeStruct) == (barStruct.getDependency(corgeStruct.getProto().getId()))"
               ,&corgeStruct,&graultSchema.super_Schema);
  }
  importPath_03.size_ = 3;
  importPath_03.ptr = importPath;
  displayName_02.content.size_ = 0x20;
  displayName_02.content.ptr = "not/used/because/already/loaded";
  diskPath_02.content.size_ = 0x1a;
  diskPath_02.content.ptr = "/usr/include/grault.capnp";
  graultSchema = SchemaParser::parseDiskFile(&parser,displayName_02,diskPath_02,importPath_03);
  Schema::getProto((Reader *)&f,&graultSchema.super_Schema);
  if (((local_450 < 0x40) || (local_460->arena != (Arena *)0x8456789abcdef123)) &&
     (kj::_::Debug::minSeverity < 3)) {
    wrongGraultSchema.super_Schema.raw = (RawBrandedSchema *)0x8456789abcdef123;
    Schema::getProto((Reader *)&f,&graultSchema.super_Schema);
    if (local_450 < 0x40) {
      local_3a0.ptr = (char *)0x0;
    }
    else {
      local_3a0.ptr = (char *)local_460->arena;
    }
    kj::_::Debug::log<char_const(&)[78],unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x86,ERROR,
               "\"failed: expected \" \"(0x8456789abcdef123ull) == (graultSchema.getProto().getId())\", 0x8456789abcdef123ull, graultSchema.getProto().getId()"
               ,(char (*) [78])
                "failed: expected (0x8456789abcdef123ull) == (graultSchema.getProto().getId())",
               (unsigned_long_long *)&wrongGraultSchema,(unsigned_long *)&local_3a0);
  }
  Schema::getProto((Reader *)&f,&graultSchema.super_Schema);
  RVar9 = capnp::schema::Node::Reader::getDisplayName((Reader *)&f);
  wrongGraultSchema.super_Schema.raw = RVar9.super_StringPtr.content.ptr;
  wrongGraultSchema.parser = RVar9.super_StringPtr.content.size_;
  bVar3 = kj::operator==("grault.capnp",(StringPtr *)&wrongGraultSchema);
  if (!bVar3 && kj::_::Debug::minSeverity < 3) {
    Schema::getProto((Reader *)&f,&graultSchema.super_Schema);
    RVar9 = capnp::schema::Node::Reader::getDisplayName((Reader *)&f);
    wrongGraultSchema.super_Schema.raw = RVar9.super_StringPtr.content.ptr;
    wrongGraultSchema.parser = RVar9.super_StringPtr.content.size_;
    kj::_::Debug::log<char_const(&)[80],char_const(&)[13],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x87,ERROR,
               "\"failed: expected \" \"(\\\"grault.capnp\\\") == (graultSchema.getProto().getDisplayName())\", \"grault.capnp\", graultSchema.getProto().getDisplayName()"
               ,(char (*) [80])
                "failed: expected (\"grault.capnp\") == (graultSchema.getProto().getDisplayName())",
               (char (*) [13])0x4dcb79,(Reader *)&wrongGraultSchema);
  }
  nestedName_02.content.size_ = 7;
  nestedName_02.content.ptr = "Grault";
  _f = (ArrayPtr<const_char>)ParsedSchema::getNested(&graultSchema,nestedName_02);
  graultStruct = Schema::asStruct((Schema *)&f);
  Schema::getProto((Reader *)&f,&graultStruct.super_Schema);
  if (local_450 < 0x40) {
    pAVar7 = (Arena *)0x0;
  }
  else {
    pAVar7 = local_460->arena;
  }
  SVar6 = Schema::getDependency(&barStruct.super_Schema,(uint64_t)pAVar7);
  if ((graultStruct.super_Schema.raw != (Schema)SVar6.raw) && (kj::_::Debug::minSeverity < 3)) {
    Schema::getProto((Reader *)&f,&graultStruct.super_Schema);
    if (local_450 < 0x40) {
      pAVar7 = (Arena *)0x0;
    }
    else {
      pAVar7 = local_460->arena;
    }
    wrongGraultSchema.super_Schema = Schema::getDependency(&barStruct.super_Schema,(uint64_t)pAVar7)
    ;
    kj::_::Debug::log<char_const(&)[94],capnp::StructSchema&,capnp::Schema>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x89,ERROR,
               "\"failed: expected \" \"(graultStruct) == (barStruct.getDependency(graultStruct.getProto().getId()))\", graultStruct, barStruct.getDependency(graultStruct.getProto().getId())"
               ,(char (*) [94])
                "failed: expected (graultStruct) == (barStruct.getDependency(graultStruct.getProto().getId()))"
               ,&graultStruct,&wrongGraultSchema.super_Schema);
  }
  importPath_04.size_ = 3;
  importPath_04.ptr = importPath;
  displayName_03.content.size_ = 0x19;
  displayName_03.content.ptr = "weird/display/name.capnp";
  diskPath_03.content.size_ = 0x1a;
  diskPath_03.content.ptr = "/opt/include/grault.capnp";
  PVar8 = SchemaParser::parseDiskFile(&parser,displayName_03,diskPath_03,importPath_04);
  wrongGraultSchema.super_Schema = PVar8.super_Schema.raw;
  wrongGraultSchema.parser = PVar8.parser;
  Schema::getProto((Reader *)&f,&wrongGraultSchema.super_Schema);
  if (((local_450 < 0x40) || (local_460->arena != (Arena *)0x8000000000000001)) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_3a0.ptr = (char *)0x8000000000000001;
    Schema::getProto((Reader *)&f,&wrongGraultSchema.super_Schema);
    if (local_450 < 0x40) {
      local_2b0 = (Arena *)0x0;
    }
    else {
      local_2b0 = local_460->arena;
    }
    kj::_::Debug::log<char_const(&)[83],unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x90,ERROR,
               "\"failed: expected \" \"(0x8000000000000001ull) == (wrongGraultSchema.getProto().getId())\", 0x8000000000000001ull, wrongGraultSchema.getProto().getId()"
               ,(char (*) [83])
                "failed: expected (0x8000000000000001ull) == (wrongGraultSchema.getProto().getId())"
               ,(unsigned_long_long *)&local_3a0,(unsigned_long *)&local_2b0);
  }
  Schema::getProto((Reader *)&f,&wrongGraultSchema.super_Schema);
  local_3a0 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName((Reader *)&f);
  bVar3 = kj::operator==("weird/display/name.capnp",(StringPtr *)&local_3a0);
  if (!bVar3 && kj::_::Debug::minSeverity < 3) {
    Schema::getProto((Reader *)&f,&wrongGraultSchema.super_Schema);
    local_3a0 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName((Reader *)&f);
    kj::_::Debug::log<char_const(&)[97],char_const(&)[25],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x91,ERROR,
               "\"failed: expected \" \"(\\\"weird/display/name.capnp\\\") == (wrongGraultSchema.getProto().getDisplayName())\", \"weird/display/name.capnp\", wrongGraultSchema.getProto().getDisplayName()"
               ,(char (*) [97])
                "failed: expected (\"weird/display/name.capnp\") == (wrongGraultSchema.getProto().getDisplayName())"
               ,(char (*) [25])"weird/display/name.capnp",(Reader *)&local_3a0);
  }
  SchemaParser::~SchemaParser(&parser);
  FakeFileReader::~FakeFileReader(&reader);
  return;
}

Assistant:

TEST(SchemaParser, Basic) {
  FakeFileReader reader;
  SchemaParser parser;
  parser.setDiskFilesystem(reader);

  reader.add("src/foo/bar.capnp",
      "@0x8123456789abcdef;\n"
      "struct Bar {\n"
      "  baz @0: import \"baz.capnp\".Baz;\n"
      "  corge @1: import \"../qux/corge.capnp\".Corge;\n"
      "  grault @2: import \"/grault.capnp\".Grault;\n"
      "  garply @3: import \"/garply.capnp\".Garply;\n"
      "}\n");
  reader.add("src/foo/baz.capnp",
      "@0x823456789abcdef1;\n"
      "struct Baz {}\n");
  reader.add("src/qux/corge.capnp",
      "@0x83456789abcdef12;\n"
      "struct Corge {}\n");
  reader.add(ABS("usr/include/grault.capnp"),
      "@0x8456789abcdef123;\n"
      "struct Grault {}\n");
  reader.add(ABS("opt/include/grault.capnp"),
      "@0x8000000000000001;\n"
      "struct WrongGrault {}\n");
  reader.add(ABS("usr/local/include/garply.capnp"),
      "@0x856789abcdef1234;\n"
      "struct Garply {}\n");

  kj::StringPtr importPath[] = {
    ABS("usr/include"), ABS("usr/local/include"), ABS("opt/include")
  };

  ParsedSchema barSchema = parser.parseDiskFile(
      "foo2/bar2.capnp", "src/foo/bar.capnp", importPath);

  auto barProto = barSchema.getProto();
  EXPECT_EQ(0x8123456789abcdefull, barProto.getId());
  EXPECT_EQ("foo2/bar2.capnp", barProto.getDisplayName());

  auto barStruct = barSchema.getNested("Bar");
  auto barFields = barStruct.asStruct().getFields();
  ASSERT_EQ(4u, barFields.size());
  EXPECT_EQ("baz", barFields[0].getProto().getName());
  EXPECT_EQ(0x823456789abcdef1ull, getFieldTypeFileId(barFields[0]));
  EXPECT_EQ("corge", barFields[1].getProto().getName());
  EXPECT_EQ(0x83456789abcdef12ull, getFieldTypeFileId(barFields[1]));
  EXPECT_EQ("grault", barFields[2].getProto().getName());
  EXPECT_EQ(0x8456789abcdef123ull, getFieldTypeFileId(barFields[2]));
  EXPECT_EQ("garply", barFields[3].getProto().getName());
  EXPECT_EQ(0x856789abcdef1234ull, getFieldTypeFileId(barFields[3]));

  auto bazSchema = parser.parseDiskFile(
      "not/used/because/already/loaded",
      "src/foo/baz.capnp", importPath);
  EXPECT_EQ(0x823456789abcdef1ull, bazSchema.getProto().getId());
  EXPECT_EQ("foo2/baz.capnp", bazSchema.getProto().getDisplayName());
  auto bazStruct = bazSchema.getNested("Baz").asStruct();
  EXPECT_EQ(bazStruct, barStruct.getDependency(bazStruct.getProto().getId()));

  auto corgeSchema = parser.parseDiskFile(
      "not/used/because/already/loaded",
      "src/qux/corge.capnp", importPath);
  EXPECT_EQ(0x83456789abcdef12ull, corgeSchema.getProto().getId());
  EXPECT_EQ("qux/corge.capnp", corgeSchema.getProto().getDisplayName());
  auto corgeStruct = corgeSchema.getNested("Corge").asStruct();
  EXPECT_EQ(corgeStruct, barStruct.getDependency(corgeStruct.getProto().getId()));

  auto graultSchema = parser.parseDiskFile(
      "not/used/because/already/loaded",
      ABS("usr/include/grault.capnp"), importPath);
  EXPECT_EQ(0x8456789abcdef123ull, graultSchema.getProto().getId());
  EXPECT_EQ("grault.capnp", graultSchema.getProto().getDisplayName());
  auto graultStruct = graultSchema.getNested("Grault").asStruct();
  EXPECT_EQ(graultStruct, barStruct.getDependency(graultStruct.getProto().getId()));

  // Try importing the other grault.capnp directly.  It'll get the display name we specify since
  // it wasn't imported before.
  auto wrongGraultSchema = parser.parseDiskFile(
      "weird/display/name.capnp",
      ABS("opt/include/grault.capnp"), importPath);
  EXPECT_EQ(0x8000000000000001ull, wrongGraultSchema.getProto().getId());
  EXPECT_EQ("weird/display/name.capnp", wrongGraultSchema.getProto().getDisplayName());
}